

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDeferredTestReporter.cpp
# Opt level: O2

void __thiscall
UnitTest::anon_unknown_0::TestDeferredTestReporterFixtureReportFailureSavesFailureDetails::RunImpl
          (TestDeferredTestReporterFixtureReportFailureSavesFailureDetails *this)

{
  TestDetails *details;
  DeferredTestReporterFixtureReportFailureSavesFailureDetailsHelper fixtureHelper;
  
  details = &(this->super_Test).m_details;
  DeferredTestReporterFixture::DeferredTestReporterFixture
            (&fixtureHelper.super_DeferredTestReporterFixture);
  fixtureHelper.m_details = details;
  ExecuteTest<UnitTest::(anonymous_namespace)::DeferredTestReporterFixtureReportFailureSavesFailureDetailsHelper>
            (&fixtureHelper,details);
  DeferredTestReporterFixture::~DeferredTestReporterFixture
            (&fixtureHelper.super_DeferredTestReporterFixture);
  return;
}

Assistant:

TEST_FIXTURE(DeferredTestReporterFixture, ReportFailureSavesFailureDetails)
{
    char const* failure = "failure";

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, failure);

    DeferredTestResult const& result = reporter.GetResults().at(0);
    CHECK(result.failed == true);
    CHECK_EQUAL(fileName.c_str(), result.failureFile);
}